

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O0

void idct64_low8_ssse3(__m128i *input,__m128i *output)

{
  undefined1 (*pauVar1) [16];
  __m128i __rounding_00;
  __m128i __rounding_01;
  __m128i __rounding_02;
  __m128i __rounding_03;
  __m128i __rounding_04;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined8 uVar109;
  undefined8 uVar110;
  undefined8 uVar111;
  undefined8 uVar112;
  undefined2 uVar113;
  short sVar114;
  uint uVar115;
  uint uVar116;
  uint uVar117;
  int iVar118;
  uint uVar119;
  uint uVar120;
  uint uVar121;
  int iVar122;
  uint uVar123;
  uint uVar124;
  uint uVar125;
  int iVar126;
  undefined4 uVar127;
  uint uVar128;
  uint uVar129;
  uint uVar130;
  int32_t *piVar131;
  undefined1 (*in_RDI) [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  __m128i d1_8;
  __m128i d0_8;
  __m128i c1_8;
  __m128i c0_8;
  __m128i b1_8;
  __m128i b0_8;
  __m128i a1_8;
  __m128i a0_8;
  __m128i v1_8;
  __m128i v0_8;
  __m128i u1_8;
  __m128i u0_8;
  __m128i t1_8;
  __m128i t0_8;
  __m128i d1_7;
  __m128i d0_7;
  __m128i c1_7;
  __m128i c0_7;
  __m128i b1_7;
  __m128i b0_7;
  __m128i a1_7;
  __m128i a0_7;
  __m128i v1_7;
  __m128i v0_7;
  __m128i u1_7;
  __m128i u0_7;
  __m128i t1_7;
  __m128i t0_7;
  __m128i d1_6;
  __m128i d0_6;
  __m128i c1_6;
  __m128i c0_6;
  __m128i b1_6;
  __m128i b0_6;
  __m128i a1_6;
  __m128i a0_6;
  __m128i v1_6;
  __m128i v0_6;
  __m128i u1_6;
  __m128i u0_6;
  __m128i t1_6;
  __m128i t0_6;
  __m128i _in_7;
  __m128i _w1_7;
  __m128i _w0_7;
  __m128i d1_5;
  __m128i d0_5;
  __m128i c1_5;
  __m128i c0_5;
  __m128i b1_5;
  __m128i b0_5;
  __m128i a1_5;
  __m128i a0_5;
  __m128i v1_5;
  __m128i v0_5;
  __m128i u1_5;
  __m128i u0_5;
  __m128i t1_5;
  __m128i t0_5;
  __m128i d1_4;
  __m128i d0_4;
  __m128i c1_4;
  __m128i c0_4;
  __m128i b1_4;
  __m128i b0_4;
  __m128i a1_4;
  __m128i a0_4;
  __m128i v1_4;
  __m128i v0_4;
  __m128i u1_4;
  __m128i u0_4;
  __m128i t1_4;
  __m128i t0_4;
  __m128i d1_3;
  __m128i d0_3;
  __m128i c1_3;
  __m128i c0_3;
  __m128i b1_3;
  __m128i b0_3;
  __m128i a1_3;
  __m128i a0_3;
  __m128i v1_3;
  __m128i v0_3;
  __m128i u1_3;
  __m128i u0_3;
  __m128i t1_3;
  __m128i t0_3;
  __m128i d1_2;
  __m128i d0_2;
  __m128i c1_2;
  __m128i c0_2;
  __m128i b1_2;
  __m128i b0_2;
  __m128i a1_2;
  __m128i a0_2;
  __m128i v1_2;
  __m128i v0_2;
  __m128i u1_2;
  __m128i u0_2;
  __m128i t1_2;
  __m128i t0_2;
  __m128i d1_1;
  __m128i d0_1;
  __m128i c1_1;
  __m128i c0_1;
  __m128i b1_1;
  __m128i b0_1;
  __m128i a1_1;
  __m128i a0_1;
  __m128i v1_1;
  __m128i v0_1;
  __m128i u1_1;
  __m128i u0_1;
  __m128i t1_1;
  __m128i t0_1;
  __m128i d1;
  __m128i d0;
  __m128i c1;
  __m128i c0;
  __m128i b1;
  __m128i b0;
  __m128i a1;
  __m128i a0;
  __m128i v1;
  __m128i v0;
  __m128i u1;
  __m128i u0;
  __m128i t1;
  __m128i t0;
  __m128i _in_6;
  __m128i _w1_6;
  __m128i _w0_6;
  __m128i _in_5;
  __m128i _w1_5;
  __m128i _w0_5;
  __m128i _in_4;
  __m128i _w1_4;
  __m128i _w0_4;
  __m128i _in_3;
  __m128i _w1_3;
  __m128i _w0_3;
  __m128i _in_2;
  __m128i _w1_2;
  __m128i _w0_2;
  __m128i _in_1;
  __m128i _w1_1;
  __m128i _w0_1;
  __m128i _in;
  __m128i _w1;
  __m128i _w0;
  __m128i x [64];
  __m128i cospi_m32_p32;
  __m128i cospi_p48_p16;
  __m128i cospi_m16_p48;
  __m128i cospi_p32_p32;
  __m128i cospi_m24_m40;
  __m128i cospi_m40_p24;
  __m128i cospi_p56_p08;
  __m128i cospi_m08_p56;
  __m128i cospi_m12_m52;
  __m128i cospi_m52_p12;
  __m128i cospi_p44_p20;
  __m128i cospi_m20_p44;
  __m128i cospi_m28_m36;
  __m128i cospi_m36_p28;
  __m128i cospi_p60_p04;
  __m128i cospi_m04_p60;
  __m128i __rounding;
  int32_t *cospi;
  int8_t cos_bit;
  int8_t cos_bit_00;
  longlong lVar149;
  longlong lVar150;
  int32_t *cospi_00;
  int8_t cos_bit_01;
  longlong lVar151;
  longlong lVar152;
  int8_t cos_bit_02;
  undefined8 uVar153;
  int8_t cos_bit_03;
  longlong lVar154;
  longlong lVar155;
  int32_t *cospi_01;
  __m128i *x_00;
  undefined2 local_1608;
  undefined2 uStack_1606;
  undefined2 uStack_1604;
  undefined2 uStack_1602;
  undefined2 local_15f8;
  undefined2 uStack_15f6;
  undefined2 uStack_15f4;
  undefined2 uStack_15f2;
  undefined2 local_15e8;
  undefined2 uStack_15e6;
  undefined2 uStack_15e4;
  undefined2 uStack_15e2;
  undefined2 local_15d8;
  undefined2 uStack_15d6;
  undefined2 uStack_15d4;
  undefined2 uStack_15d2;
  undefined2 local_15c8;
  undefined2 uStack_15c6;
  undefined2 uStack_15c4;
  undefined2 uStack_15c2;
  undefined2 local_15b8;
  undefined2 uStack_15b6;
  undefined2 uStack_15b4;
  undefined2 uStack_15b2;
  undefined2 local_15a8;
  undefined2 uStack_15a6;
  undefined2 uStack_15a4;
  undefined2 uStack_15a2;
  undefined2 local_1598;
  undefined2 uStack_1596;
  undefined2 uStack_1594;
  undefined2 uStack_1592;
  undefined2 local_1588;
  undefined2 uStack_1586;
  undefined2 uStack_1584;
  undefined2 uStack_1582;
  undefined2 local_1578;
  undefined2 uStack_1576;
  undefined2 uStack_1574;
  undefined2 uStack_1572;
  undefined2 local_1568;
  undefined2 uStack_1566;
  undefined2 uStack_1564;
  undefined2 uStack_1562;
  undefined2 local_1558;
  undefined2 uStack_1556;
  undefined2 uStack_1554;
  undefined2 uStack_1552;
  undefined2 local_1548;
  undefined2 uStack_1546;
  undefined2 uStack_1544;
  undefined2 uStack_1542;
  undefined2 local_1538;
  undefined2 uStack_1536;
  undefined2 uStack_1534;
  undefined2 uStack_1532;
  undefined2 local_1528;
  undefined2 uStack_1526;
  undefined2 uStack_1524;
  undefined2 uStack_1522;
  undefined2 local_1518;
  undefined2 uStack_1516;
  undefined2 uStack_1514;
  undefined2 uStack_1512;
  undefined2 uStack_14e0;
  undefined2 uStack_14de;
  undefined2 uStack_14dc;
  undefined2 uStack_14da;
  undefined2 uStack_14d0;
  undefined2 uStack_14ce;
  undefined2 uStack_14cc;
  undefined2 uStack_14ca;
  undefined2 uStack_14c0;
  undefined2 uStack_14be;
  undefined2 uStack_14bc;
  undefined2 uStack_14ba;
  undefined2 uStack_14b0;
  undefined2 uStack_14ae;
  undefined2 uStack_14ac;
  undefined2 uStack_14aa;
  undefined2 uStack_14a0;
  undefined2 uStack_149e;
  undefined2 uStack_149c;
  undefined2 uStack_149a;
  undefined2 uStack_1490;
  undefined2 uStack_148e;
  undefined2 uStack_148c;
  undefined2 uStack_148a;
  undefined2 uStack_1480;
  undefined2 uStack_147e;
  undefined2 uStack_147c;
  undefined2 uStack_147a;
  undefined2 uStack_1470;
  undefined2 uStack_146e;
  undefined2 uStack_146c;
  undefined2 uStack_146a;
  undefined2 uStack_1460;
  undefined2 uStack_145e;
  undefined2 uStack_145c;
  undefined2 uStack_145a;
  undefined2 uStack_1450;
  undefined2 uStack_144e;
  undefined2 uStack_144c;
  undefined2 uStack_144a;
  undefined2 uStack_1440;
  undefined2 uStack_143e;
  undefined2 uStack_143c;
  undefined2 uStack_143a;
  undefined2 uStack_1430;
  undefined2 uStack_142e;
  undefined2 uStack_142c;
  undefined2 uStack_142a;
  undefined2 uStack_1420;
  undefined2 uStack_141e;
  undefined2 uStack_141c;
  undefined2 uStack_141a;
  undefined2 uStack_1410;
  undefined2 uStack_140e;
  undefined2 uStack_140c;
  undefined2 uStack_140a;
  undefined2 uStack_1400;
  undefined2 uStack_13fe;
  undefined2 uStack_13fc;
  undefined2 uStack_13fa;
  undefined2 uStack_13f0;
  undefined2 uStack_13ee;
  undefined2 uStack_13ec;
  undefined2 uStack_13ea;
  int local_f58;
  int iStack_f54;
  int iStack_f50;
  int iStack_f4c;
  int local_f38;
  int iStack_f34;
  int iStack_f30;
  int iStack_f2c;
  int local_f18;
  int iStack_f14;
  int iStack_f10;
  int iStack_f0c;
  int local_ef8;
  int iStack_ef4;
  int iStack_ef0;
  int iStack_eec;
  int local_ed8;
  int iStack_ed4;
  int iStack_ed0;
  int iStack_ecc;
  int local_eb8;
  int iStack_eb4;
  int iStack_eb0;
  int iStack_eac;
  int local_e98;
  int iStack_e94;
  int iStack_e90;
  int iStack_e8c;
  int local_e78;
  int iStack_e74;
  int iStack_e70;
  int iStack_e6c;
  int local_e58;
  int iStack_e54;
  int iStack_e50;
  int iStack_e4c;
  int local_e38;
  int iStack_e34;
  int iStack_e30;
  int iStack_e2c;
  int local_e18;
  int iStack_e14;
  int iStack_e10;
  int iStack_e0c;
  int local_df8;
  int iStack_df4;
  int iStack_df0;
  int iStack_dec;
  int local_dd8;
  int iStack_dd4;
  int iStack_dd0;
  int iStack_dcc;
  int local_db8;
  int iStack_db4;
  int iStack_db0;
  int iStack_dac;
  int local_d98;
  int iStack_d94;
  int iStack_d90;
  int iStack_d8c;
  int local_d78;
  int iStack_d74;
  int iStack_d70;
  int iStack_d6c;
  int local_d58;
  int iStack_d54;
  int iStack_d50;
  int iStack_d4c;
  int local_d38;
  int iStack_d34;
  int iStack_d30;
  int iStack_d2c;
  int local_d18;
  int iStack_d14;
  int iStack_d10;
  int iStack_d0c;
  int local_cf8;
  int iStack_cf4;
  int iStack_cf0;
  int iStack_cec;
  int local_cd8;
  int iStack_cd4;
  int iStack_cd0;
  int iStack_ccc;
  int local_cb8;
  int iStack_cb4;
  int iStack_cb0;
  int iStack_cac;
  int local_c98;
  int iStack_c94;
  int iStack_c90;
  int iStack_c8c;
  int local_c78;
  int iStack_c74;
  int iStack_c70;
  int iStack_c6c;
  int local_c58;
  int iStack_c54;
  int iStack_c50;
  int iStack_c4c;
  int local_c38;
  int iStack_c34;
  int iStack_c30;
  int iStack_c2c;
  int local_c18;
  int iStack_c14;
  int iStack_c10;
  int iStack_c0c;
  int local_bf8;
  int iStack_bf4;
  int iStack_bf0;
  int iStack_bec;
  int local_bd8;
  int iStack_bd4;
  int iStack_bd0;
  int iStack_bcc;
  int local_bb8;
  int iStack_bb4;
  int iStack_bb0;
  int iStack_bac;
  int local_b98;
  int iStack_b94;
  int iStack_b90;
  int iStack_b8c;
  int local_b78;
  int iStack_b74;
  int iStack_b70;
  int iStack_b6c;
  int local_b58;
  int iStack_b54;
  int iStack_b50;
  int iStack_b4c;
  int local_b38;
  int iStack_b34;
  int iStack_b30;
  int iStack_b2c;
  int local_b18;
  int iStack_b14;
  int iStack_b10;
  int iStack_b0c;
  int local_af8;
  int iStack_af4;
  int iStack_af0;
  int iStack_aec;
  
  piVar131 = cospi_arr(0xc);
  uVar115 = -piVar131[4] & 0xffffU | piVar131[0x3c] << 0x10;
  uVar116 = (uint)*(ushort *)(piVar131 + 0x3c) | piVar131[4] << 0x10;
  uVar117 = -piVar131[0x24] & 0xffffU | piVar131[0x1c] << 0x10;
  iVar118 = (-piVar131[0x1c] & 0xffffU) + piVar131[0x24] * -0x10000;
  uVar119 = -piVar131[0x14] & 0xffffU | piVar131[0x2c] << 0x10;
  uVar120 = (uint)*(ushort *)(piVar131 + 0x2c) | piVar131[0x14] << 0x10;
  uVar121 = -piVar131[0x34] & 0xffffU | piVar131[0xc] << 0x10;
  iVar122 = (-piVar131[0xc] & 0xffffU) + piVar131[0x34] * -0x10000;
  uVar123 = -piVar131[8] & 0xffffU | piVar131[0x38] << 0x10;
  uVar124 = (uint)*(ushort *)(piVar131 + 0x38) | piVar131[8] << 0x10;
  uVar125 = -piVar131[0x28] & 0xffffU | piVar131[0x18] << 0x10;
  iVar126 = (-piVar131[0x18] & 0xffffU) + piVar131[0x28] * -0x10000;
  uVar127 = CONCAT22((short)piVar131[0x20],(short)piVar131[0x20]);
  uVar109 = CONCAT44(uVar127,uVar127);
  uVar110 = CONCAT44(uVar127,uVar127);
  uVar128 = -piVar131[0x10] & 0xffffU | piVar131[0x30] << 0x10;
  uVar129 = (uint)*(ushort *)(piVar131 + 0x30) | piVar131[0x10] << 0x10;
  uVar130 = -piVar131[0x20] & 0xffffU | piVar131[0x20] << 0x10;
  uVar111 = CONCAT44(uVar130,uVar130);
  uVar112 = CONCAT44(uVar130,uVar130);
  pauVar1 = in_RDI + 3;
  cospi_01 = *(int32_t **)*pauVar1;
  x_00 = *(__m128i **)(in_RDI[3] + 8);
  uVar113 = (undefined2)(piVar131[0x3f] << 3);
  auVar147._2_2_ = uVar113;
  auVar147._0_2_ = uVar113;
  auVar147._4_2_ = uVar113;
  auVar147._6_2_ = uVar113;
  auVar147._10_2_ = uVar113;
  auVar147._8_2_ = uVar113;
  auVar147._12_2_ = uVar113;
  auVar147._14_2_ = uVar113;
  uVar113 = (undefined2)(piVar131[1] << 3);
  auVar146._2_2_ = uVar113;
  auVar146._0_2_ = uVar113;
  auVar146._4_2_ = uVar113;
  auVar146._6_2_ = uVar113;
  auVar146._10_2_ = uVar113;
  auVar146._8_2_ = uVar113;
  auVar146._12_2_ = uVar113;
  auVar146._14_2_ = uVar113;
  auVar132 = pmulhrsw(in_RDI[1],auVar147);
  auVar133 = pmulhrsw(in_RDI[1],auVar146);
  sVar114 = (short)piVar131[0x39] * -8;
  auVar134._2_2_ = sVar114;
  auVar134._0_2_ = sVar114;
  auVar134._4_2_ = sVar114;
  auVar134._6_2_ = sVar114;
  auVar134._10_2_ = sVar114;
  auVar134._8_2_ = sVar114;
  auVar134._12_2_ = sVar114;
  auVar134._14_2_ = sVar114;
  uVar113 = (undefined2)(piVar131[7] << 3);
  auVar135._2_2_ = uVar113;
  auVar135._0_2_ = uVar113;
  auVar135._4_2_ = uVar113;
  auVar135._6_2_ = uVar113;
  auVar135._10_2_ = uVar113;
  auVar135._8_2_ = uVar113;
  auVar135._12_2_ = uVar113;
  auVar135._14_2_ = uVar113;
  auVar134 = pmulhrsw(in_RDI[7],auVar134);
  auVar135 = pmulhrsw(in_RDI[7],auVar135);
  uVar113 = (undefined2)(piVar131[0x3b] << 3);
  auVar136._2_2_ = uVar113;
  auVar136._0_2_ = uVar113;
  auVar136._4_2_ = uVar113;
  auVar136._6_2_ = uVar113;
  auVar136._10_2_ = uVar113;
  auVar136._8_2_ = uVar113;
  auVar136._12_2_ = uVar113;
  auVar136._14_2_ = uVar113;
  uVar113 = (undefined2)(piVar131[5] << 3);
  auVar137._2_2_ = uVar113;
  auVar137._0_2_ = uVar113;
  auVar137._4_2_ = uVar113;
  auVar137._6_2_ = uVar113;
  auVar137._10_2_ = uVar113;
  auVar137._8_2_ = uVar113;
  auVar137._12_2_ = uVar113;
  auVar137._14_2_ = uVar113;
  auVar136 = pmulhrsw(in_RDI[5],auVar136);
  auVar137 = pmulhrsw(in_RDI[5],auVar137);
  sVar114 = (short)piVar131[0x3d] * -8;
  auVar138._2_2_ = sVar114;
  auVar138._0_2_ = sVar114;
  auVar138._4_2_ = sVar114;
  auVar138._6_2_ = sVar114;
  auVar138._10_2_ = sVar114;
  auVar138._8_2_ = sVar114;
  auVar138._12_2_ = sVar114;
  auVar138._14_2_ = sVar114;
  uVar113 = (undefined2)(piVar131[3] << 3);
  auVar139._2_2_ = uVar113;
  auVar139._0_2_ = uVar113;
  auVar139._4_2_ = uVar113;
  auVar139._6_2_ = uVar113;
  auVar139._10_2_ = uVar113;
  auVar139._8_2_ = uVar113;
  auVar139._12_2_ = uVar113;
  auVar139._14_2_ = uVar113;
  auVar138 = pmulhrsw(*pauVar1,auVar138);
  auVar139 = pmulhrsw(*pauVar1,auVar139);
  uVar113 = (undefined2)(piVar131[0x3e] << 3);
  lVar155 = CONCAT26(uVar113,CONCAT24(uVar113,CONCAT22(uVar113,uVar113)));
  auVar140._10_2_ = uVar113;
  auVar140._8_2_ = uVar113;
  auVar140._12_2_ = uVar113;
  auVar140._14_2_ = uVar113;
  uVar113 = (undefined2)(piVar131[2] << 3);
  uVar153 = CONCAT26(uVar113,CONCAT24(uVar113,CONCAT22(uVar113,uVar113)));
  lVar154 = CONCAT26(uVar113,CONCAT24(uVar113,CONCAT22(uVar113,uVar113)));
  auVar140._0_8_ = lVar155;
  auVar140 = pmulhrsw(in_RDI[2],auVar140);
  auVar141._8_8_ = lVar154;
  auVar141._0_8_ = uVar153;
  auVar141 = pmulhrsw(in_RDI[2],auVar141);
  sVar114 = (short)piVar131[0x3a] * -8;
  auVar142._2_2_ = sVar114;
  auVar142._0_2_ = sVar114;
  auVar142._4_2_ = sVar114;
  auVar142._6_2_ = sVar114;
  auVar142._10_2_ = sVar114;
  auVar142._8_2_ = sVar114;
  auVar142._12_2_ = sVar114;
  auVar142._14_2_ = sVar114;
  uVar113 = (undefined2)(piVar131[6] << 3);
  auVar143._2_2_ = uVar113;
  auVar143._0_2_ = uVar113;
  auVar143._4_2_ = uVar113;
  auVar143._6_2_ = uVar113;
  auVar143._10_2_ = uVar113;
  auVar143._8_2_ = uVar113;
  auVar143._12_2_ = uVar113;
  auVar143._14_2_ = uVar113;
  auVar142 = pmulhrsw(in_RDI[6],auVar142);
  auVar143 = pmulhrsw(in_RDI[6],auVar143);
  uVar113 = (undefined2)(piVar131[0x3c] << 3);
  auVar144._2_2_ = uVar113;
  auVar144._0_2_ = uVar113;
  auVar144._4_2_ = uVar113;
  auVar144._6_2_ = uVar113;
  auVar144._10_2_ = uVar113;
  auVar144._8_2_ = uVar113;
  auVar144._12_2_ = uVar113;
  auVar144._14_2_ = uVar113;
  uVar113 = (undefined2)(piVar131[4] << 3);
  auVar145._2_2_ = uVar113;
  auVar145._0_2_ = uVar113;
  auVar145._4_2_ = uVar113;
  auVar145._6_2_ = uVar113;
  auVar145._10_2_ = uVar113;
  auVar145._8_2_ = uVar113;
  auVar145._12_2_ = uVar113;
  auVar145._14_2_ = uVar113;
  auVar144 = pmulhrsw(in_RDI[4],auVar144);
  auVar145 = pmulhrsw(in_RDI[4],auVar145);
  local_1518 = auVar132._0_2_;
  uStack_1516 = auVar132._2_2_;
  uStack_1514 = auVar132._4_2_;
  uStack_1512 = auVar132._6_2_;
  local_1528 = auVar133._0_2_;
  uStack_1526 = auVar133._2_2_;
  uStack_1524 = auVar133._4_2_;
  uStack_1522 = auVar133._6_2_;
  uStack_13f0 = auVar132._8_2_;
  uStack_13ee = auVar132._10_2_;
  uStack_13ec = auVar132._12_2_;
  uStack_13ea = auVar132._14_2_;
  uStack_1400 = auVar133._8_2_;
  uStack_13fe = auVar133._10_2_;
  uStack_13fc = auVar133._12_2_;
  uStack_13fa = auVar133._14_2_;
  auVar72._2_2_ = local_1528;
  auVar72._0_2_ = local_1518;
  auVar72._4_2_ = uStack_1516;
  auVar72._6_2_ = uStack_1526;
  auVar72._10_2_ = uStack_1524;
  auVar72._8_2_ = uStack_1514;
  auVar72._12_2_ = uStack_1512;
  auVar72._14_2_ = uStack_1522;
  auVar71._8_8_ = CONCAT44(uVar115,uVar115);
  auVar71._0_8_ = CONCAT44(uVar115,uVar115);
  auVar132 = pmaddwd(auVar72,auVar71);
  auVar70._2_2_ = uStack_1400;
  auVar70._0_2_ = uStack_13f0;
  auVar70._4_2_ = uStack_13ee;
  auVar70._6_2_ = uStack_13fe;
  auVar70._10_2_ = uStack_13fc;
  auVar70._8_2_ = uStack_13ec;
  auVar70._12_2_ = uStack_13ea;
  auVar70._14_2_ = uStack_13fa;
  auVar69._8_8_ = CONCAT44(uVar115,uVar115);
  auVar69._0_8_ = CONCAT44(uVar115,uVar115);
  auVar133 = pmaddwd(auVar70,auVar69);
  auVar68._2_2_ = local_1528;
  auVar68._0_2_ = local_1518;
  auVar68._4_2_ = uStack_1516;
  auVar68._6_2_ = uStack_1526;
  auVar68._10_2_ = uStack_1524;
  auVar68._8_2_ = uStack_1514;
  auVar68._12_2_ = uStack_1512;
  auVar68._14_2_ = uStack_1522;
  auVar67._8_8_ = CONCAT44(uVar116,uVar116);
  auVar67._0_8_ = CONCAT44(uVar116,uVar116);
  auVar146 = pmaddwd(auVar68,auVar67);
  auVar66._2_2_ = uStack_1400;
  auVar66._0_2_ = uStack_13f0;
  auVar66._4_2_ = uStack_13ee;
  auVar66._6_2_ = uStack_13fe;
  auVar66._10_2_ = uStack_13fc;
  auVar66._8_2_ = uStack_13ec;
  auVar66._12_2_ = uStack_13ea;
  auVar66._14_2_ = uStack_13fa;
  auVar65._8_8_ = CONCAT44(uVar116,uVar116);
  auVar65._0_8_ = CONCAT44(uVar116,uVar116);
  auVar147 = pmaddwd(auVar66,auVar65);
  local_af8 = auVar132._0_4_;
  iStack_af4 = auVar132._4_4_;
  iStack_af0 = auVar132._8_4_;
  iStack_aec = auVar132._12_4_;
  local_af8 = local_af8 + 0x800;
  iStack_af4 = iStack_af4 + 0x800;
  iStack_af0 = iStack_af0 + 0x800;
  iStack_aec = iStack_aec + 0x800;
  local_b18 = auVar133._0_4_;
  iStack_b14 = auVar133._4_4_;
  iStack_b10 = auVar133._8_4_;
  iStack_b0c = auVar133._12_4_;
  iStack_b14 = iStack_b14 + 0x800;
  iStack_b10 = iStack_b10 + 0x800;
  iStack_b0c = iStack_b0c + 0x800;
  local_b38 = auVar146._0_4_;
  iStack_b34 = auVar146._4_4_;
  iStack_b30 = auVar146._8_4_;
  iStack_b2c = auVar146._12_4_;
  local_b58 = auVar147._0_4_;
  iStack_b54 = auVar147._4_4_;
  iStack_b50 = auVar147._8_4_;
  iStack_b4c = auVar147._12_4_;
  auVar132 = ZEXT416(0xc);
  auVar133 = ZEXT416(0xc);
  auVar146 = ZEXT416(0xc);
  auVar148 = ZEXT416(0xc);
  auVar108._4_4_ = iStack_af4 >> auVar132;
  auVar108._0_4_ = local_af8 >> auVar132;
  auVar108._12_4_ = iStack_aec >> auVar132;
  auVar108._8_4_ = iStack_af0 >> auVar132;
  auVar107._4_4_ = iStack_b14 >> auVar133;
  auVar107._0_4_ = local_b18 + 0x800 >> auVar133;
  auVar107._12_4_ = iStack_b0c >> auVar133;
  auVar107._8_4_ = iStack_b10 >> auVar133;
  packssdw(auVar108,auVar107);
  auVar106._4_4_ = iStack_b34 + 0x800 >> auVar146;
  auVar106._0_4_ = local_b38 + 0x800 >> auVar146;
  auVar106._12_4_ = iStack_b2c + 0x800 >> auVar146;
  auVar106._8_4_ = iStack_b30 + 0x800 >> auVar146;
  auVar105._4_4_ = iStack_b54 + 0x800 >> auVar148;
  auVar105._0_4_ = local_b58 + 0x800 >> auVar148;
  auVar105._12_4_ = iStack_b4c + 0x800 >> auVar148;
  auVar105._8_4_ = iStack_b50 + 0x800 >> auVar148;
  packssdw(auVar106,auVar105);
  local_1538 = auVar134._0_2_;
  uStack_1536 = auVar134._2_2_;
  uStack_1534 = auVar134._4_2_;
  uStack_1532 = auVar134._6_2_;
  local_1548 = auVar135._0_2_;
  uStack_1546 = auVar135._2_2_;
  uStack_1544 = auVar135._4_2_;
  uStack_1542 = auVar135._6_2_;
  uStack_1410 = auVar134._8_2_;
  uStack_140e = auVar134._10_2_;
  uStack_140c = auVar134._12_2_;
  uStack_140a = auVar134._14_2_;
  uStack_1420 = auVar135._8_2_;
  uStack_141e = auVar135._10_2_;
  uStack_141c = auVar135._12_2_;
  uStack_141a = auVar135._14_2_;
  auVar64._2_2_ = local_1548;
  auVar64._0_2_ = local_1538;
  auVar64._4_2_ = uStack_1536;
  auVar64._6_2_ = uStack_1546;
  auVar64._10_2_ = uStack_1544;
  auVar64._8_2_ = uStack_1534;
  auVar64._12_2_ = uStack_1532;
  auVar64._14_2_ = uStack_1542;
  auVar63._8_8_ = CONCAT44(iVar118,iVar118);
  auVar63._0_8_ = CONCAT44(iVar118,iVar118);
  auVar132 = pmaddwd(auVar64,auVar63);
  auVar62._2_2_ = uStack_1420;
  auVar62._0_2_ = uStack_1410;
  auVar62._4_2_ = uStack_140e;
  auVar62._6_2_ = uStack_141e;
  auVar62._10_2_ = uStack_141c;
  auVar62._8_2_ = uStack_140c;
  auVar62._12_2_ = uStack_140a;
  auVar62._14_2_ = uStack_141a;
  auVar61._8_8_ = CONCAT44(iVar118,iVar118);
  auVar61._0_8_ = CONCAT44(iVar118,iVar118);
  auVar133 = pmaddwd(auVar62,auVar61);
  auVar60._2_2_ = local_1548;
  auVar60._0_2_ = local_1538;
  auVar60._4_2_ = uStack_1536;
  auVar60._6_2_ = uStack_1546;
  auVar60._10_2_ = uStack_1544;
  auVar60._8_2_ = uStack_1534;
  auVar60._12_2_ = uStack_1532;
  auVar60._14_2_ = uStack_1542;
  auVar59._8_8_ = CONCAT44(uVar117,uVar117);
  auVar59._0_8_ = CONCAT44(uVar117,uVar117);
  auVar135 = pmaddwd(auVar60,auVar59);
  auVar58._2_2_ = uStack_1420;
  auVar58._0_2_ = uStack_1410;
  auVar58._4_2_ = uStack_140e;
  auVar58._6_2_ = uStack_141e;
  auVar58._10_2_ = uStack_141c;
  auVar58._8_2_ = uStack_140c;
  auVar58._12_2_ = uStack_140a;
  auVar58._14_2_ = uStack_141a;
  auVar57._8_8_ = CONCAT44(uVar117,uVar117);
  auVar57._0_8_ = CONCAT44(uVar117,uVar117);
  auVar134 = pmaddwd(auVar58,auVar57);
  local_b78 = auVar132._0_4_;
  iStack_b74 = auVar132._4_4_;
  iStack_b70 = auVar132._8_4_;
  iStack_b6c = auVar132._12_4_;
  local_b98 = auVar133._0_4_;
  iStack_b94 = auVar133._4_4_;
  iStack_b90 = auVar133._8_4_;
  iStack_b8c = auVar133._12_4_;
  local_bb8 = auVar135._0_4_;
  iStack_bb4 = auVar135._4_4_;
  iStack_bb0 = auVar135._8_4_;
  iStack_bac = auVar135._12_4_;
  local_bd8 = auVar134._0_4_;
  iStack_bd4 = auVar134._4_4_;
  iStack_bd0 = auVar134._8_4_;
  iStack_bcc = auVar134._12_4_;
  auVar132 = ZEXT416(0xc);
  auVar133 = ZEXT416(0xc);
  auVar146 = ZEXT416(0xc);
  auVar148 = ZEXT416(0xc);
  auVar104._4_4_ = iStack_b74 + 0x800 >> auVar132;
  auVar104._0_4_ = local_b78 + 0x800 >> auVar132;
  auVar104._12_4_ = iStack_b6c + 0x800 >> auVar132;
  auVar104._8_4_ = iStack_b70 + 0x800 >> auVar132;
  auVar103._4_4_ = iStack_b94 + 0x800 >> auVar133;
  auVar103._0_4_ = local_b98 + 0x800 >> auVar133;
  auVar103._12_4_ = iStack_b8c + 0x800 >> auVar133;
  auVar103._8_4_ = iStack_b90 + 0x800 >> auVar133;
  packssdw(auVar104,auVar103);
  auVar102._4_4_ = iStack_bb4 + 0x800 >> auVar146;
  auVar102._0_4_ = local_bb8 + 0x800 >> auVar146;
  auVar102._12_4_ = iStack_bac + 0x800 >> auVar146;
  auVar102._8_4_ = iStack_bb0 + 0x800 >> auVar146;
  auVar101._4_4_ = iStack_bd4 + 0x800 >> auVar148;
  auVar101._0_4_ = local_bd8 + 0x800 >> auVar148;
  auVar101._12_4_ = iStack_bcc + 0x800 >> auVar148;
  auVar101._8_4_ = iStack_bd0 + 0x800 >> auVar148;
  packssdw(auVar102,auVar101);
  local_1558 = auVar136._0_2_;
  uStack_1556 = auVar136._2_2_;
  uStack_1554 = auVar136._4_2_;
  uStack_1552 = auVar136._6_2_;
  local_1568 = auVar137._0_2_;
  uStack_1566 = auVar137._2_2_;
  uStack_1564 = auVar137._4_2_;
  uStack_1562 = auVar137._6_2_;
  uStack_1430 = auVar136._8_2_;
  uStack_142e = auVar136._10_2_;
  uStack_142c = auVar136._12_2_;
  uStack_142a = auVar136._14_2_;
  uStack_1440 = auVar137._8_2_;
  uStack_143e = auVar137._10_2_;
  uStack_143c = auVar137._12_2_;
  uStack_143a = auVar137._14_2_;
  auVar56._2_2_ = local_1568;
  auVar56._0_2_ = local_1558;
  auVar56._4_2_ = uStack_1556;
  auVar56._6_2_ = uStack_1566;
  auVar56._10_2_ = uStack_1564;
  auVar56._8_2_ = uStack_1554;
  auVar56._12_2_ = uStack_1552;
  auVar56._14_2_ = uStack_1562;
  auVar55._8_8_ = CONCAT44(uVar119,uVar119);
  auVar55._0_8_ = CONCAT44(uVar119,uVar119);
  auVar137 = pmaddwd(auVar56,auVar55);
  auVar54._2_2_ = uStack_1440;
  auVar54._0_2_ = uStack_1430;
  auVar54._4_2_ = uStack_142e;
  auVar54._6_2_ = uStack_143e;
  auVar54._10_2_ = uStack_143c;
  auVar54._8_2_ = uStack_142c;
  auVar54._12_2_ = uStack_142a;
  auVar54._14_2_ = uStack_143a;
  auVar53._8_8_ = CONCAT44(uVar119,uVar119);
  auVar53._0_8_ = CONCAT44(uVar119,uVar119);
  auVar132 = pmaddwd(auVar54,auVar53);
  lVar152 = auVar132._0_8_;
  auVar52._2_2_ = local_1568;
  auVar52._0_2_ = local_1558;
  auVar52._4_2_ = uStack_1556;
  auVar52._6_2_ = uStack_1566;
  auVar52._10_2_ = uStack_1564;
  auVar52._8_2_ = uStack_1554;
  auVar52._12_2_ = uStack_1552;
  auVar52._14_2_ = uStack_1562;
  auVar51._8_8_ = CONCAT44(uVar120,uVar120);
  auVar51._0_8_ = CONCAT44(uVar120,uVar120);
  auVar133 = pmaddwd(auVar52,auVar51);
  cos_bit_01 = auVar133[7];
  lVar151 = auVar133._8_8_;
  auVar50._2_2_ = uStack_1440;
  auVar50._0_2_ = uStack_1430;
  auVar50._4_2_ = uStack_142e;
  auVar50._6_2_ = uStack_143e;
  auVar50._10_2_ = uStack_143c;
  auVar50._8_2_ = uStack_142c;
  auVar50._12_2_ = uStack_142a;
  auVar50._14_2_ = uStack_143a;
  auVar49._8_8_ = CONCAT44(uVar120,uVar120);
  auVar49._0_8_ = CONCAT44(uVar120,uVar120);
  auVar136 = pmaddwd(auVar50,auVar49);
  local_bf8 = auVar137._0_4_;
  iStack_bf4 = auVar137._4_4_;
  iStack_bf0 = auVar137._8_4_;
  iStack_bec = auVar137._12_4_;
  local_c18 = auVar132._0_4_;
  iStack_c14 = auVar132._4_4_;
  iStack_c10 = auVar132._8_4_;
  iStack_c0c = auVar132._12_4_;
  local_c38 = auVar133._0_4_;
  iStack_c34 = auVar133._4_4_;
  iStack_c30 = auVar133._8_4_;
  iStack_c2c = auVar133._12_4_;
  local_c58 = auVar136._0_4_;
  iStack_c54 = auVar136._4_4_;
  iStack_c50 = auVar136._8_4_;
  iStack_c4c = auVar136._12_4_;
  auVar132 = ZEXT416(0xc);
  auVar133 = ZEXT416(0xc);
  auVar136 = ZEXT416(0xc);
  auVar146 = ZEXT416(0xc);
  auVar100._4_4_ = iStack_bf4 + 0x800 >> auVar132;
  auVar100._0_4_ = local_bf8 + 0x800 >> auVar132;
  auVar100._12_4_ = iStack_bec + 0x800 >> auVar132;
  auVar100._8_4_ = iStack_bf0 + 0x800 >> auVar132;
  auVar99._4_4_ = iStack_c14 + 0x800 >> auVar133;
  auVar99._0_4_ = local_c18 + 0x800 >> auVar133;
  auVar99._12_4_ = iStack_c0c + 0x800 >> auVar133;
  auVar99._8_4_ = iStack_c10 + 0x800 >> auVar133;
  packssdw(auVar100,auVar99);
  auVar98._4_4_ = iStack_c34 + 0x800 >> auVar136;
  auVar98._0_4_ = local_c38 + 0x800 >> auVar136;
  auVar98._12_4_ = iStack_c2c + 0x800 >> auVar136;
  auVar98._8_4_ = iStack_c30 + 0x800 >> auVar136;
  auVar97._4_4_ = iStack_c54 + 0x800 >> auVar146;
  auVar97._0_4_ = local_c58 + 0x800 >> auVar146;
  auVar97._12_4_ = iStack_c4c + 0x800 >> auVar146;
  auVar97._8_4_ = iStack_c50 + 0x800 >> auVar146;
  packssdw(auVar98,auVar97);
  local_1578 = auVar138._0_2_;
  uStack_1576 = auVar138._2_2_;
  uStack_1574 = auVar138._4_2_;
  uStack_1572 = auVar138._6_2_;
  local_1588 = auVar139._0_2_;
  uStack_1586 = auVar139._2_2_;
  uStack_1584 = auVar139._4_2_;
  uStack_1582 = auVar139._6_2_;
  uStack_1450 = auVar138._8_2_;
  uStack_144e = auVar138._10_2_;
  uStack_144c = auVar138._12_2_;
  uStack_144a = auVar138._14_2_;
  uStack_1460 = auVar139._8_2_;
  uStack_145e = auVar139._10_2_;
  uStack_145c = auVar139._12_2_;
  uStack_145a = auVar139._14_2_;
  auVar48._2_2_ = local_1588;
  auVar48._0_2_ = local_1578;
  auVar48._4_2_ = uStack_1576;
  auVar48._6_2_ = uStack_1586;
  auVar48._10_2_ = uStack_1584;
  auVar48._8_2_ = uStack_1574;
  auVar48._12_2_ = uStack_1572;
  auVar48._14_2_ = uStack_1582;
  auVar47._8_8_ = CONCAT44(iVar122,iVar122);
  auVar47._0_8_ = CONCAT44(iVar122,iVar122);
  auVar132 = pmaddwd(auVar48,auVar47);
  auVar46._2_2_ = uStack_1460;
  auVar46._0_2_ = uStack_1450;
  auVar46._4_2_ = uStack_144e;
  auVar46._6_2_ = uStack_145e;
  auVar46._10_2_ = uStack_145c;
  auVar46._8_2_ = uStack_144c;
  auVar46._12_2_ = uStack_144a;
  auVar46._14_2_ = uStack_145a;
  auVar45._8_8_ = CONCAT44(iVar122,iVar122);
  auVar45._0_8_ = CONCAT44(iVar122,iVar122);
  auVar139 = pmaddwd(auVar46,auVar45);
  auVar44._2_2_ = local_1588;
  auVar44._0_2_ = local_1578;
  auVar44._4_2_ = uStack_1576;
  auVar44._6_2_ = uStack_1586;
  auVar44._10_2_ = uStack_1584;
  auVar44._8_2_ = uStack_1574;
  auVar44._12_2_ = uStack_1572;
  auVar44._14_2_ = uStack_1582;
  auVar43._8_8_ = CONCAT44(uVar121,uVar121);
  auVar43._0_8_ = CONCAT44(uVar121,uVar121);
  auVar133 = pmaddwd(auVar44,auVar43);
  lVar150 = auVar133._0_8_;
  cospi_00 = auVar133._8_8_;
  auVar42._2_2_ = uStack_1460;
  auVar42._0_2_ = uStack_1450;
  auVar42._4_2_ = uStack_144e;
  auVar42._6_2_ = uStack_145e;
  auVar42._10_2_ = uStack_145c;
  auVar42._8_2_ = uStack_144c;
  auVar42._12_2_ = uStack_144a;
  auVar42._14_2_ = uStack_145a;
  auVar41._8_8_ = CONCAT44(uVar121,uVar121);
  auVar41._0_8_ = CONCAT44(uVar121,uVar121);
  auVar138 = pmaddwd(auVar42,auVar41);
  cos_bit_00 = auVar138[7];
  lVar149 = auVar138._8_8_;
  local_c78 = auVar132._0_4_;
  iStack_c74 = auVar132._4_4_;
  iStack_c70 = auVar132._8_4_;
  iStack_c6c = auVar132._12_4_;
  local_c98 = auVar139._0_4_;
  iStack_c94 = auVar139._4_4_;
  iStack_c90 = auVar139._8_4_;
  iStack_c8c = auVar139._12_4_;
  local_cb8 = auVar133._0_4_;
  iStack_cb4 = auVar133._4_4_;
  iStack_cb0 = auVar133._8_4_;
  iStack_cac = auVar133._12_4_;
  local_cd8 = auVar138._0_4_;
  iStack_cd4 = auVar138._4_4_;
  iStack_cd0 = auVar138._8_4_;
  iStack_ccc = auVar138._12_4_;
  auVar132 = ZEXT416(0xc);
  auVar133 = ZEXT416(0xc);
  auVar138 = ZEXT416(0xc);
  auVar136 = ZEXT416(0xc);
  auVar96._4_4_ = iStack_c74 + 0x800 >> auVar132;
  auVar96._0_4_ = local_c78 + 0x800 >> auVar132;
  auVar96._12_4_ = iStack_c6c + 0x800 >> auVar132;
  auVar96._8_4_ = iStack_c70 + 0x800 >> auVar132;
  auVar95._4_4_ = iStack_c94 + 0x800 >> auVar133;
  auVar95._0_4_ = local_c98 + 0x800 >> auVar133;
  auVar95._12_4_ = iStack_c8c + 0x800 >> auVar133;
  auVar95._8_4_ = iStack_c90 + 0x800 >> auVar133;
  packssdw(auVar96,auVar95);
  auVar94._4_4_ = iStack_cb4 + 0x800 >> auVar138;
  auVar94._0_4_ = local_cb8 + 0x800 >> auVar138;
  auVar94._12_4_ = iStack_cac + 0x800 >> auVar138;
  auVar94._8_4_ = iStack_cb0 + 0x800 >> auVar138;
  auVar93._4_4_ = iStack_cd4 + 0x800 >> auVar136;
  auVar93._0_4_ = local_cd8 + 0x800 >> auVar136;
  auVar93._12_4_ = iStack_ccc + 0x800 >> auVar136;
  auVar93._8_4_ = iStack_cd0 + 0x800 >> auVar136;
  packssdw(auVar94,auVar93);
  local_1598 = auVar140._0_2_;
  uStack_1596 = auVar140._2_2_;
  uStack_1594 = auVar140._4_2_;
  uStack_1592 = auVar140._6_2_;
  local_15a8 = auVar141._0_2_;
  uStack_15a6 = auVar141._2_2_;
  uStack_15a4 = auVar141._4_2_;
  uStack_15a2 = auVar141._6_2_;
  uStack_1470 = auVar140._8_2_;
  uStack_146e = auVar140._10_2_;
  uStack_146c = auVar140._12_2_;
  uStack_146a = auVar140._14_2_;
  uStack_1480 = auVar141._8_2_;
  uStack_147e = auVar141._10_2_;
  uStack_147c = auVar141._12_2_;
  uStack_147a = auVar141._14_2_;
  auVar40._2_2_ = local_15a8;
  auVar40._0_2_ = local_1598;
  auVar40._4_2_ = uStack_1596;
  auVar40._6_2_ = uStack_15a6;
  auVar40._10_2_ = uStack_15a4;
  auVar40._8_2_ = uStack_1594;
  auVar40._12_2_ = uStack_1592;
  auVar40._14_2_ = uStack_15a2;
  auVar39._8_8_ = CONCAT44(uVar123,uVar123);
  auVar39._0_8_ = CONCAT44(uVar123,uVar123);
  auVar132 = pmaddwd(auVar40,auVar39);
  auVar38._2_2_ = uStack_1480;
  auVar38._0_2_ = uStack_1470;
  auVar38._4_2_ = uStack_146e;
  auVar38._6_2_ = uStack_147e;
  auVar38._10_2_ = uStack_147c;
  auVar38._8_2_ = uStack_146c;
  auVar38._12_2_ = uStack_146a;
  auVar38._14_2_ = uStack_147a;
  auVar37._8_8_ = CONCAT44(uVar123,uVar123);
  auVar37._0_8_ = CONCAT44(uVar123,uVar123);
  auVar133 = pmaddwd(auVar38,auVar37);
  auVar36._2_2_ = local_15a8;
  auVar36._0_2_ = local_1598;
  auVar36._4_2_ = uStack_1596;
  auVar36._6_2_ = uStack_15a6;
  auVar36._10_2_ = uStack_15a4;
  auVar36._8_2_ = uStack_1594;
  auVar36._12_2_ = uStack_1592;
  auVar36._14_2_ = uStack_15a2;
  auVar35._8_8_ = CONCAT44(uVar124,uVar124);
  auVar35._0_8_ = CONCAT44(uVar124,uVar124);
  auVar141 = pmaddwd(auVar36,auVar35);
  auVar34._2_2_ = uStack_1480;
  auVar34._0_2_ = uStack_1470;
  auVar34._4_2_ = uStack_146e;
  auVar34._6_2_ = uStack_147e;
  auVar34._10_2_ = uStack_147c;
  auVar34._8_2_ = uStack_146c;
  auVar34._12_2_ = uStack_146a;
  auVar34._14_2_ = uStack_147a;
  auVar33._8_8_ = CONCAT44(uVar124,uVar124);
  auVar33._0_8_ = CONCAT44(uVar124,uVar124);
  auVar140 = pmaddwd(auVar34,auVar33);
  local_cf8 = auVar132._0_4_;
  iStack_cf4 = auVar132._4_4_;
  iStack_cf0 = auVar132._8_4_;
  iStack_cec = auVar132._12_4_;
  local_d18 = auVar133._0_4_;
  iStack_d14 = auVar133._4_4_;
  iStack_d10 = auVar133._8_4_;
  iStack_d0c = auVar133._12_4_;
  local_d38 = auVar141._0_4_;
  iStack_d34 = auVar141._4_4_;
  iStack_d30 = auVar141._8_4_;
  iStack_d2c = auVar141._12_4_;
  local_d58 = auVar140._0_4_;
  iStack_d54 = auVar140._4_4_;
  iStack_d50 = auVar140._8_4_;
  iStack_d4c = auVar140._12_4_;
  auVar132 = ZEXT416(0xc);
  auVar133 = ZEXT416(0xc);
  auVar141 = ZEXT416(0xc);
  auVar140 = ZEXT416(0xc);
  auVar92._4_4_ = iStack_cf4 + 0x800 >> auVar132;
  auVar92._0_4_ = local_cf8 + 0x800 >> auVar132;
  auVar92._12_4_ = iStack_cec + 0x800 >> auVar132;
  auVar92._8_4_ = iStack_cf0 + 0x800 >> auVar132;
  auVar91._4_4_ = iStack_d14 + 0x800 >> auVar133;
  auVar91._0_4_ = local_d18 + 0x800 >> auVar133;
  auVar91._12_4_ = iStack_d0c + 0x800 >> auVar133;
  auVar91._8_4_ = iStack_d10 + 0x800 >> auVar133;
  packssdw(auVar92,auVar91);
  auVar90._4_4_ = iStack_d34 + 0x800 >> auVar141;
  auVar90._0_4_ = local_d38 + 0x800 >> auVar141;
  auVar90._12_4_ = iStack_d2c + 0x800 >> auVar141;
  auVar90._8_4_ = iStack_d30 + 0x800 >> auVar141;
  auVar89._4_4_ = iStack_d54 + 0x800 >> auVar140;
  auVar89._0_4_ = local_d58 + 0x800 >> auVar140;
  auVar89._12_4_ = iStack_d4c + 0x800 >> auVar140;
  auVar89._8_4_ = iStack_d50 + 0x800 >> auVar140;
  packssdw(auVar90,auVar89);
  local_15b8 = auVar142._0_2_;
  uStack_15b6 = auVar142._2_2_;
  uStack_15b4 = auVar142._4_2_;
  uStack_15b2 = auVar142._6_2_;
  local_15c8 = auVar143._0_2_;
  uStack_15c6 = auVar143._2_2_;
  uStack_15c4 = auVar143._4_2_;
  uStack_15c2 = auVar143._6_2_;
  uStack_1490 = auVar142._8_2_;
  uStack_148e = auVar142._10_2_;
  uStack_148c = auVar142._12_2_;
  uStack_148a = auVar142._14_2_;
  uStack_14a0 = auVar143._8_2_;
  uStack_149e = auVar143._10_2_;
  uStack_149c = auVar143._12_2_;
  uStack_149a = auVar143._14_2_;
  auVar32._2_2_ = local_15c8;
  auVar32._0_2_ = local_15b8;
  auVar32._4_2_ = uStack_15b6;
  auVar32._6_2_ = uStack_15c6;
  auVar32._10_2_ = uStack_15c4;
  auVar32._8_2_ = uStack_15b4;
  auVar32._12_2_ = uStack_15b2;
  auVar32._14_2_ = uStack_15c2;
  auVar31._8_8_ = CONCAT44(iVar126,iVar126);
  auVar31._0_8_ = CONCAT44(iVar126,iVar126);
  auVar132 = pmaddwd(auVar32,auVar31);
  auVar30._2_2_ = uStack_14a0;
  auVar30._0_2_ = uStack_1490;
  auVar30._4_2_ = uStack_148e;
  auVar30._6_2_ = uStack_149e;
  auVar30._10_2_ = uStack_149c;
  auVar30._8_2_ = uStack_148c;
  auVar30._12_2_ = uStack_148a;
  auVar30._14_2_ = uStack_149a;
  auVar29._8_8_ = CONCAT44(iVar126,iVar126);
  auVar29._0_8_ = CONCAT44(iVar126,iVar126);
  auVar133 = pmaddwd(auVar30,auVar29);
  auVar28._2_2_ = local_15c8;
  auVar28._0_2_ = local_15b8;
  auVar28._4_2_ = uStack_15b6;
  auVar28._6_2_ = uStack_15c6;
  auVar28._10_2_ = uStack_15c4;
  auVar28._8_2_ = uStack_15b4;
  auVar28._12_2_ = uStack_15b2;
  auVar28._14_2_ = uStack_15c2;
  auVar27._8_8_ = CONCAT44(uVar125,uVar125);
  auVar27._0_8_ = CONCAT44(uVar125,uVar125);
  auVar143 = pmaddwd(auVar28,auVar27);
  auVar26._2_2_ = uStack_14a0;
  auVar26._0_2_ = uStack_1490;
  auVar26._4_2_ = uStack_148e;
  auVar26._6_2_ = uStack_149e;
  auVar26._10_2_ = uStack_149c;
  auVar26._8_2_ = uStack_148c;
  auVar26._12_2_ = uStack_148a;
  auVar26._14_2_ = uStack_149a;
  auVar25._8_8_ = CONCAT44(uVar125,uVar125);
  auVar25._0_8_ = CONCAT44(uVar125,uVar125);
  auVar142 = pmaddwd(auVar26,auVar25);
  local_d78 = auVar132._0_4_;
  iStack_d74 = auVar132._4_4_;
  iStack_d70 = auVar132._8_4_;
  iStack_d6c = auVar132._12_4_;
  local_d98 = auVar133._0_4_;
  iStack_d94 = auVar133._4_4_;
  iStack_d90 = auVar133._8_4_;
  iStack_d8c = auVar133._12_4_;
  local_db8 = auVar143._0_4_;
  iStack_db4 = auVar143._4_4_;
  iStack_db0 = auVar143._8_4_;
  iStack_dac = auVar143._12_4_;
  local_dd8 = auVar142._0_4_;
  iStack_dd4 = auVar142._4_4_;
  iStack_dd0 = auVar142._8_4_;
  iStack_dcc = auVar142._12_4_;
  auVar132 = ZEXT416(0xc);
  auVar133 = ZEXT416(0xc);
  auVar141 = ZEXT416(0xc);
  auVar140 = ZEXT416(0xc);
  auVar88._4_4_ = iStack_d74 + 0x800 >> auVar132;
  auVar88._0_4_ = local_d78 + 0x800 >> auVar132;
  auVar88._12_4_ = iStack_d6c + 0x800 >> auVar132;
  auVar88._8_4_ = iStack_d70 + 0x800 >> auVar132;
  auVar87._4_4_ = iStack_d94 + 0x800 >> auVar133;
  auVar87._0_4_ = local_d98 + 0x800 >> auVar133;
  auVar87._12_4_ = iStack_d8c + 0x800 >> auVar133;
  auVar87._8_4_ = iStack_d90 + 0x800 >> auVar133;
  packssdw(auVar88,auVar87);
  auVar86._4_4_ = iStack_db4 + 0x800 >> auVar141;
  auVar86._0_4_ = local_db8 + 0x800 >> auVar141;
  auVar86._12_4_ = iStack_dac + 0x800 >> auVar141;
  auVar86._8_4_ = iStack_db0 + 0x800 >> auVar141;
  auVar85._4_4_ = iStack_dd4 + 0x800 >> auVar140;
  auVar85._0_4_ = local_dd8 + 0x800 >> auVar140;
  auVar85._12_4_ = iStack_dcc + 0x800 >> auVar140;
  auVar85._8_4_ = iStack_dd0 + 0x800 >> auVar140;
  packssdw(auVar86,auVar85);
  uVar113 = (undefined2)(piVar131[0x20] << 3);
  auVar133._2_2_ = uVar113;
  auVar133._0_2_ = uVar113;
  auVar133._4_2_ = uVar113;
  auVar133._6_2_ = uVar113;
  auVar133._10_2_ = uVar113;
  auVar133._8_2_ = uVar113;
  auVar133._12_2_ = uVar113;
  auVar133._14_2_ = uVar113;
  uVar113 = (undefined2)(piVar131[0x20] << 3);
  auVar132._2_2_ = uVar113;
  auVar132._0_2_ = uVar113;
  auVar132._4_2_ = uVar113;
  auVar132._6_2_ = uVar113;
  auVar132._10_2_ = uVar113;
  auVar132._8_2_ = uVar113;
  auVar132._12_2_ = uVar113;
  auVar132._14_2_ = uVar113;
  pmulhrsw(*in_RDI,auVar133);
  pmulhrsw(*in_RDI,auVar132);
  local_15d8 = auVar144._0_2_;
  uStack_15d6 = auVar144._2_2_;
  uStack_15d4 = auVar144._4_2_;
  uStack_15d2 = auVar144._6_2_;
  local_15e8 = auVar145._0_2_;
  uStack_15e6 = auVar145._2_2_;
  uStack_15e4 = auVar145._4_2_;
  uStack_15e2 = auVar145._6_2_;
  uStack_14b0 = auVar144._8_2_;
  uStack_14ae = auVar144._10_2_;
  uStack_14ac = auVar144._12_2_;
  uStack_14aa = auVar144._14_2_;
  uStack_14c0 = auVar145._8_2_;
  uStack_14be = auVar145._10_2_;
  uStack_14bc = auVar145._12_2_;
  uStack_14ba = auVar145._14_2_;
  auVar24._2_2_ = local_15e8;
  auVar24._0_2_ = local_15d8;
  auVar24._4_2_ = uStack_15d6;
  auVar24._6_2_ = uStack_15e6;
  auVar24._10_2_ = uStack_15e4;
  auVar24._8_2_ = uStack_15d4;
  auVar24._12_2_ = uStack_15d2;
  auVar24._14_2_ = uStack_15e2;
  auVar23._8_8_ = CONCAT44(uVar128,uVar128);
  auVar23._0_8_ = CONCAT44(uVar128,uVar128);
  auVar132 = pmaddwd(auVar24,auVar23);
  auVar22._2_2_ = uStack_14c0;
  auVar22._0_2_ = uStack_14b0;
  auVar22._4_2_ = uStack_14ae;
  auVar22._6_2_ = uStack_14be;
  auVar22._10_2_ = uStack_14bc;
  auVar22._8_2_ = uStack_14ac;
  auVar22._12_2_ = uStack_14aa;
  auVar22._14_2_ = uStack_14ba;
  auVar21._8_8_ = CONCAT44(uVar128,uVar128);
  auVar21._0_8_ = CONCAT44(uVar128,uVar128);
  auVar133 = pmaddwd(auVar22,auVar21);
  auVar20._2_2_ = local_15e8;
  auVar20._0_2_ = local_15d8;
  auVar20._4_2_ = uStack_15d6;
  auVar20._6_2_ = uStack_15e6;
  auVar20._10_2_ = uStack_15e4;
  auVar20._8_2_ = uStack_15d4;
  auVar20._12_2_ = uStack_15d2;
  auVar20._14_2_ = uStack_15e2;
  auVar19._8_8_ = CONCAT44(uVar129,uVar129);
  auVar19._0_8_ = CONCAT44(uVar129,uVar129);
  auVar145 = pmaddwd(auVar20,auVar19);
  auVar18._2_2_ = uStack_14c0;
  auVar18._0_2_ = uStack_14b0;
  auVar18._4_2_ = uStack_14ae;
  auVar18._6_2_ = uStack_14be;
  auVar18._10_2_ = uStack_14bc;
  auVar18._8_2_ = uStack_14ac;
  auVar18._12_2_ = uStack_14aa;
  auVar18._14_2_ = uStack_14ba;
  auVar17._8_8_ = CONCAT44(uVar129,uVar129);
  auVar17._0_8_ = CONCAT44(uVar129,uVar129);
  auVar144 = pmaddwd(auVar18,auVar17);
  local_df8 = auVar132._0_4_;
  iStack_df4 = auVar132._4_4_;
  iStack_df0 = auVar132._8_4_;
  iStack_dec = auVar132._12_4_;
  local_e18 = auVar133._0_4_;
  iStack_e14 = auVar133._4_4_;
  iStack_e10 = auVar133._8_4_;
  iStack_e0c = auVar133._12_4_;
  local_e38 = auVar145._0_4_;
  iStack_e34 = auVar145._4_4_;
  iStack_e30 = auVar145._8_4_;
  iStack_e2c = auVar145._12_4_;
  local_e58 = auVar144._0_4_;
  iStack_e54 = auVar144._4_4_;
  iStack_e50 = auVar144._8_4_;
  iStack_e4c = auVar144._12_4_;
  auVar132 = ZEXT416(0xc);
  auVar133 = ZEXT416(0xc);
  auVar145 = ZEXT416(0xc);
  auVar144 = ZEXT416(0xc);
  auVar84._4_4_ = iStack_df4 + 0x800 >> auVar132;
  auVar84._0_4_ = local_df8 + 0x800 >> auVar132;
  auVar84._12_4_ = iStack_dec + 0x800 >> auVar132;
  auVar84._8_4_ = iStack_df0 + 0x800 >> auVar132;
  auVar83._4_4_ = iStack_e14 + 0x800 >> auVar133;
  auVar83._0_4_ = local_e18 + 0x800 >> auVar133;
  auVar83._12_4_ = iStack_e0c + 0x800 >> auVar133;
  auVar83._8_4_ = iStack_e10 + 0x800 >> auVar133;
  auVar132 = packssdw(auVar84,auVar83);
  auVar82._4_4_ = iStack_e34 + 0x800 >> auVar145;
  auVar82._0_4_ = local_e38 + 0x800 >> auVar145;
  auVar82._12_4_ = iStack_e2c + 0x800 >> auVar145;
  auVar82._8_4_ = iStack_e30 + 0x800 >> auVar145;
  auVar81._4_4_ = iStack_e54 + 0x800 >> auVar144;
  auVar81._0_4_ = local_e58 + 0x800 >> auVar144;
  auVar81._12_4_ = iStack_e4c + 0x800 >> auVar144;
  auVar81._8_4_ = iStack_e50 + 0x800 >> auVar144;
  auVar133 = packssdw(auVar82,auVar81);
  __rounding_02[0]._4_4_ = iStack_b6c + 0x800;
  __rounding_02[0]._0_4_ = iStack_b70 + 0x800;
  __rounding_02[1] = auVar134._0_8_;
  idct64_stage6_high32_sse2
            (auVar135._8_8_,auVar135._0_8_,__rounding_02,
             (int8_t)((uint)(iStack_b74 + 0x800) >> 0x18));
  cos_bit_03 = (int8_t)((ulong)uVar153 >> 0x38);
  cos_bit_02 = (int8_t)((uint)iStack_b14 >> 0x18);
  __rounding_00[1] = lVar150;
  __rounding_00[0] = lVar149;
  idct64_stage7_high48_sse2(auVar139._0_8_,cospi_00,__rounding_00,cos_bit_00);
  local_15f8 = auVar132._0_2_;
  uStack_15f6 = auVar132._2_2_;
  uStack_15f4 = auVar132._4_2_;
  uStack_15f2 = auVar132._6_2_;
  local_1608 = auVar133._0_2_;
  uStack_1606 = auVar133._2_2_;
  uStack_1604 = auVar133._4_2_;
  uStack_1602 = auVar133._6_2_;
  uStack_14d0 = auVar132._8_2_;
  uStack_14ce = auVar132._10_2_;
  uStack_14cc = auVar132._12_2_;
  uStack_14ca = auVar132._14_2_;
  uStack_14e0 = auVar133._8_2_;
  uStack_14de = auVar133._10_2_;
  uStack_14dc = auVar133._12_2_;
  uStack_14da = auVar133._14_2_;
  auVar16._2_2_ = local_1608;
  auVar16._0_2_ = local_15f8;
  auVar16._4_2_ = uStack_15f6;
  auVar16._6_2_ = uStack_1606;
  auVar16._10_2_ = uStack_1604;
  auVar16._8_2_ = uStack_15f4;
  auVar16._12_2_ = uStack_15f2;
  auVar16._14_2_ = uStack_1602;
  auVar15._8_8_ = uVar112;
  auVar15._0_8_ = uVar111;
  auVar132 = pmaddwd(auVar16,auVar15);
  auVar14._2_2_ = uStack_14e0;
  auVar14._0_2_ = uStack_14d0;
  auVar14._4_2_ = uStack_14ce;
  auVar14._6_2_ = uStack_14de;
  auVar14._10_2_ = uStack_14dc;
  auVar14._8_2_ = uStack_14cc;
  auVar14._12_2_ = uStack_14ca;
  auVar14._14_2_ = uStack_14da;
  auVar13._8_8_ = uVar112;
  auVar13._0_8_ = uVar111;
  auVar133 = pmaddwd(auVar14,auVar13);
  auVar12._2_2_ = local_1608;
  auVar12._0_2_ = local_15f8;
  auVar12._4_2_ = uStack_15f6;
  auVar12._6_2_ = uStack_1606;
  auVar12._10_2_ = uStack_1604;
  auVar12._8_2_ = uStack_15f4;
  auVar12._12_2_ = uStack_15f2;
  auVar12._14_2_ = uStack_1602;
  auVar11._8_8_ = uVar110;
  auVar11._0_8_ = uVar109;
  auVar145 = pmaddwd(auVar12,auVar11);
  auVar10._2_2_ = uStack_14e0;
  auVar10._0_2_ = uStack_14d0;
  auVar10._4_2_ = uStack_14ce;
  auVar10._6_2_ = uStack_14de;
  auVar10._10_2_ = uStack_14dc;
  auVar10._8_2_ = uStack_14cc;
  auVar10._12_2_ = uStack_14ca;
  auVar10._14_2_ = uStack_14da;
  auVar9._8_8_ = uVar110;
  auVar9._0_8_ = uVar109;
  auVar144 = pmaddwd(auVar10,auVar9);
  local_e78 = auVar132._0_4_;
  iStack_e74 = auVar132._4_4_;
  iStack_e70 = auVar132._8_4_;
  iStack_e6c = auVar132._12_4_;
  local_e98 = auVar133._0_4_;
  iStack_e94 = auVar133._4_4_;
  iStack_e90 = auVar133._8_4_;
  iStack_e8c = auVar133._12_4_;
  local_eb8 = auVar145._0_4_;
  iStack_eb4 = auVar145._4_4_;
  iStack_eb0 = auVar145._8_4_;
  iStack_eac = auVar145._12_4_;
  local_ed8 = auVar144._0_4_;
  iStack_ed4 = auVar144._4_4_;
  iStack_ed0 = auVar144._8_4_;
  iStack_ecc = auVar144._12_4_;
  auVar132 = ZEXT416(0xc);
  auVar133 = ZEXT416(0xc);
  auVar145 = ZEXT416(0xc);
  auVar144 = ZEXT416(0xc);
  auVar80._4_4_ = iStack_e74 + 0x800 >> auVar132;
  auVar80._0_4_ = local_e78 + 0x800 >> auVar132;
  auVar80._12_4_ = iStack_e6c + 0x800 >> auVar132;
  auVar80._8_4_ = iStack_e70 + 0x800 >> auVar132;
  auVar79._4_4_ = iStack_e94 + 0x800 >> auVar133;
  auVar79._0_4_ = local_e98 + 0x800 >> auVar133;
  auVar79._12_4_ = iStack_e8c + 0x800 >> auVar133;
  auVar79._8_4_ = iStack_e90 + 0x800 >> auVar133;
  packssdw(auVar80,auVar79);
  auVar78._4_4_ = iStack_eb4 + 0x800 >> auVar145;
  auVar78._0_4_ = local_eb8 + 0x800 >> auVar145;
  auVar78._12_4_ = iStack_eac + 0x800 >> auVar145;
  auVar78._8_4_ = iStack_eb0 + 0x800 >> auVar145;
  auVar77._4_4_ = iStack_ed4 + 0x800 >> auVar144;
  auVar77._0_4_ = local_ed8 + 0x800 >> auVar144;
  auVar77._12_4_ = iStack_ecc + 0x800 >> auVar144;
  auVar77._8_4_ = iStack_ed0 + 0x800 >> auVar144;
  packssdw(auVar78,auVar77);
  auVar8._2_2_ = local_15e8;
  auVar8._0_2_ = local_15d8;
  auVar8._4_2_ = uStack_15d6;
  auVar8._6_2_ = uStack_15e6;
  auVar8._10_2_ = uStack_15e4;
  auVar8._8_2_ = uStack_15d4;
  auVar8._12_2_ = uStack_15d2;
  auVar8._14_2_ = uStack_15e2;
  auVar7._8_8_ = uVar112;
  auVar7._0_8_ = uVar111;
  auVar132 = pmaddwd(auVar8,auVar7);
  auVar6._2_2_ = uStack_14c0;
  auVar6._0_2_ = uStack_14b0;
  auVar6._4_2_ = uStack_14ae;
  auVar6._6_2_ = uStack_14be;
  auVar6._10_2_ = uStack_14bc;
  auVar6._8_2_ = uStack_14ac;
  auVar6._12_2_ = uStack_14aa;
  auVar6._14_2_ = uStack_14ba;
  auVar5._8_8_ = uVar112;
  auVar5._0_8_ = uVar111;
  auVar133 = pmaddwd(auVar6,auVar5);
  auVar4._2_2_ = local_15e8;
  auVar4._0_2_ = local_15d8;
  auVar4._4_2_ = uStack_15d6;
  auVar4._6_2_ = uStack_15e6;
  auVar4._10_2_ = uStack_15e4;
  auVar4._8_2_ = uStack_15d4;
  auVar4._12_2_ = uStack_15d2;
  auVar4._14_2_ = uStack_15e2;
  auVar3._8_8_ = uVar110;
  auVar3._0_8_ = uVar109;
  auVar145 = pmaddwd(auVar4,auVar3);
  auVar2._2_2_ = uStack_14c0;
  auVar2._0_2_ = uStack_14b0;
  auVar2._4_2_ = uStack_14ae;
  auVar2._6_2_ = uStack_14be;
  auVar2._10_2_ = uStack_14bc;
  auVar2._8_2_ = uStack_14ac;
  auVar2._12_2_ = uStack_14aa;
  auVar2._14_2_ = uStack_14ba;
  auVar148._8_8_ = uVar110;
  auVar148._0_8_ = uVar109;
  auVar144 = pmaddwd(auVar2,auVar148);
  local_ef8 = auVar132._0_4_;
  iStack_ef4 = auVar132._4_4_;
  iStack_ef0 = auVar132._8_4_;
  iStack_eec = auVar132._12_4_;
  local_f18 = auVar133._0_4_;
  iStack_f14 = auVar133._4_4_;
  iStack_f10 = auVar133._8_4_;
  iStack_f0c = auVar133._12_4_;
  local_f38 = auVar145._0_4_;
  iStack_f34 = auVar145._4_4_;
  iStack_f30 = auVar145._8_4_;
  iStack_f2c = auVar145._12_4_;
  local_f58 = auVar144._0_4_;
  iStack_f54 = auVar144._4_4_;
  iStack_f50 = auVar144._8_4_;
  iStack_f4c = auVar144._12_4_;
  auVar132 = ZEXT416(0xc);
  auVar133 = ZEXT416(0xc);
  auVar145 = ZEXT416(0xc);
  auVar144 = ZEXT416(0xc);
  auVar76._4_4_ = iStack_ef4 + 0x800 >> auVar132;
  auVar76._0_4_ = local_ef8 + 0x800 >> auVar132;
  auVar76._12_4_ = iStack_eec + 0x800 >> auVar132;
  auVar76._8_4_ = iStack_ef0 + 0x800 >> auVar132;
  auVar75._4_4_ = iStack_f14 + 0x800 >> auVar133;
  auVar75._0_4_ = local_f18 + 0x800 >> auVar133;
  auVar75._12_4_ = iStack_f0c + 0x800 >> auVar133;
  auVar75._8_4_ = iStack_f10 + 0x800 >> auVar133;
  packssdw(auVar76,auVar75);
  auVar74._4_4_ = iStack_f34 + 0x800 >> auVar145;
  auVar74._0_4_ = local_f38 + 0x800 >> auVar145;
  auVar74._12_4_ = iStack_f2c + 0x800 >> auVar145;
  auVar74._8_4_ = iStack_f30 + 0x800 >> auVar145;
  auVar73._4_4_ = iStack_f54 + 0x800 >> auVar144;
  auVar73._0_4_ = local_f58 + 0x800 >> auVar144;
  auVar73._12_4_ = iStack_f4c + 0x800 >> auVar144;
  auVar73._8_4_ = iStack_f50 + 0x800 >> auVar144;
  packssdw(auVar74,auVar73);
  __rounding_03[0]._4_4_ = iStack_b0c;
  __rounding_03[0]._0_4_ = iStack_b10;
  __rounding_03[1]._0_4_ = local_af8;
  __rounding_03[1]._4_4_ = iStack_af4;
  idct64_stage8_high48_sse2
            (auVar147._0_8_,(int32_t *)CONCAT44(iStack_aec,iStack_af0),__rounding_03,cos_bit_02);
  __rounding_01[1] = lVar152;
  __rounding_01[0] = lVar151;
  idct64_stage9_sse2(auVar137._8_8_,auVar137._0_8_,__rounding_01,cos_bit_01);
  __rounding_04[1] = lVar155;
  __rounding_04[0] = lVar154;
  idct64_stage10_sse2(x_00,cospi_01,__rounding_04,cos_bit_03);
  idct64_stage11_sse2(auVar143._0_8_,auVar142._8_8_);
  return;
}

Assistant:

static void idct64_low8_ssse3(const __m128i *input, __m128i *output) {
  const int8_t cos_bit = INV_COS_BIT;
  const int32_t *cospi = cospi_arr(INV_COS_BIT);
  const __m128i __rounding = _mm_set1_epi32(1 << (INV_COS_BIT - 1));
  const __m128i cospi_m04_p60 = pair_set_epi16(-cospi[4], cospi[60]);
  const __m128i cospi_p60_p04 = pair_set_epi16(cospi[60], cospi[4]);
  const __m128i cospi_m36_p28 = pair_set_epi16(-cospi[36], cospi[28]);
  const __m128i cospi_m28_m36 = pair_set_epi16(-cospi[28], -cospi[36]);
  const __m128i cospi_m20_p44 = pair_set_epi16(-cospi[20], cospi[44]);
  const __m128i cospi_p44_p20 = pair_set_epi16(cospi[44], cospi[20]);
  const __m128i cospi_m52_p12 = pair_set_epi16(-cospi[52], cospi[12]);
  const __m128i cospi_m12_m52 = pair_set_epi16(-cospi[12], -cospi[52]);
  const __m128i cospi_m08_p56 = pair_set_epi16(-cospi[8], cospi[56]);
  const __m128i cospi_p56_p08 = pair_set_epi16(cospi[56], cospi[8]);
  const __m128i cospi_m40_p24 = pair_set_epi16(-cospi[40], cospi[24]);
  const __m128i cospi_m24_m40 = pair_set_epi16(-cospi[24], -cospi[40]);
  const __m128i cospi_p32_p32 = pair_set_epi16(cospi[32], cospi[32]);
  const __m128i cospi_m16_p48 = pair_set_epi16(-cospi[16], cospi[48]);
  const __m128i cospi_p48_p16 = pair_set_epi16(cospi[48], cospi[16]);
  const __m128i cospi_m32_p32 = pair_set_epi16(-cospi[32], cospi[32]);

  // stage 1
  __m128i x[64];
  x[0] = input[0];
  x[8] = input[4];
  x[16] = input[2];
  x[24] = input[6];
  x[32] = input[1];
  x[40] = input[5];
  x[48] = input[3];
  x[56] = input[7];

  // stage 2
  btf_16_ssse3(cospi[63], cospi[1], x[32], x[32], x[63]);
  btf_16_ssse3(-cospi[57], cospi[7], x[56], x[39], x[56]);
  btf_16_ssse3(cospi[59], cospi[5], x[40], x[40], x[55]);
  btf_16_ssse3(-cospi[61], cospi[3], x[48], x[47], x[48]);

  // stage 3
  btf_16_ssse3(cospi[62], cospi[2], x[16], x[16], x[31]);
  btf_16_ssse3(-cospi[58], cospi[6], x[24], x[23], x[24]);
  x[33] = x[32];
  x[38] = x[39];
  x[41] = x[40];
  x[46] = x[47];
  x[49] = x[48];
  x[54] = x[55];
  x[57] = x[56];
  x[62] = x[63];

  // stage 4
  btf_16_ssse3(cospi[60], cospi[4], x[8], x[8], x[15]);
  x[17] = x[16];
  x[22] = x[23];
  x[25] = x[24];
  x[30] = x[31];
  btf_16_sse2(cospi_m04_p60, cospi_p60_p04, x[33], x[62], x[33], x[62]);
  btf_16_sse2(cospi_m28_m36, cospi_m36_p28, x[38], x[57], x[38], x[57]);
  btf_16_sse2(cospi_m20_p44, cospi_p44_p20, x[41], x[54], x[41], x[54]);
  btf_16_sse2(cospi_m12_m52, cospi_m52_p12, x[46], x[49], x[46], x[49]);

  // stage 5
  x[9] = x[8];
  x[14] = x[15];
  btf_16_sse2(cospi_m08_p56, cospi_p56_p08, x[17], x[30], x[17], x[30]);
  btf_16_sse2(cospi_m24_m40, cospi_m40_p24, x[22], x[25], x[22], x[25]);
  x[35] = x[32];
  x[34] = x[33];
  x[36] = x[39];
  x[37] = x[38];
  x[43] = x[40];
  x[42] = x[41];
  x[44] = x[47];
  x[45] = x[46];
  x[51] = x[48];
  x[50] = x[49];
  x[52] = x[55];
  x[53] = x[54];
  x[59] = x[56];
  x[58] = x[57];
  x[60] = x[63];
  x[61] = x[62];

  // stage 6
  btf_16_ssse3(cospi[32], cospi[32], x[0], x[0], x[1]);
  btf_16_sse2(cospi_m16_p48, cospi_p48_p16, x[9], x[14], x[9], x[14]);
  x[19] = x[16];
  x[18] = x[17];
  x[20] = x[23];
  x[21] = x[22];
  x[27] = x[24];
  x[26] = x[25];
  x[28] = x[31];
  x[29] = x[30];
  idct64_stage6_high32_sse2(x, cospi, __rounding, cos_bit);

  // stage 7
  x[3] = x[0];
  x[2] = x[1];
  x[11] = x[8];
  x[10] = x[9];
  x[12] = x[15];
  x[13] = x[14];
  idct64_stage7_high48_sse2(x, cospi, __rounding, cos_bit);

  // stage 8
  x[7] = x[0];
  x[6] = x[1];
  x[5] = x[2];
  x[4] = x[3];
  btf_16_sse2(cospi_m32_p32, cospi_p32_p32, x[10], x[13], x[10], x[13]);
  btf_16_sse2(cospi_m32_p32, cospi_p32_p32, x[11], x[12], x[11], x[12]);
  idct64_stage8_high48_sse2(x, cospi, __rounding, cos_bit);

  idct64_stage9_sse2(x, cospi, __rounding, cos_bit);
  idct64_stage10_sse2(x, cospi, __rounding, cos_bit);
  idct64_stage11_sse2(output, x);
}